

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O0

bool __thiscall
metal::scatter(metal *this,ray *r_in,hit_record *rec,vec3 *attenuation,ray *scattered)

{
  vec3 v;
  vec3 *u;
  double time;
  double dVar1;
  double in_stack_fffffffffffffed0;
  vec3 local_110;
  vec3 local_f8;
  vec3 local_e0;
  vec3 local_c8;
  ray local_b0;
  vec3 local_78;
  vec3 local_60;
  undefined1 local_48 [8];
  vec3 reflected;
  ray *scattered_local;
  vec3 *attenuation_local;
  hit_record *rec_local;
  ray *r_in_local;
  metal *this_local;
  
  reflected.e[2] = (double)scattered;
  ray::direction(&local_78,r_in);
  v.e[1] = local_78.e[2];
  v.e[0] = local_78.e[1];
  v.e[2] = in_stack_fffffffffffffed0;
  unit_vector(v);
  reflect((vec3 *)local_48,&local_60,&rec->normal);
  dVar1 = this->fuzz;
  random_in_sphere();
  operator*(&local_e0,dVar1,&local_f8);
  u = (vec3 *)local_48;
  operator+(&local_c8,u,&local_e0);
  ray::time(r_in,(time_t *)u);
  ray::ray(&local_b0,&rec->p,&local_c8,time);
  memcpy((void *)reflected.e[2],&local_b0,0x38);
  attenuation->e[0] = (this->albedo).e[0];
  attenuation->e[1] = (this->albedo).e[1];
  attenuation->e[2] = (this->albedo).e[2];
  ray::direction(&local_110,(ray *)reflected.e[2]);
  dVar1 = dot(&local_110,&rec->normal);
  return 0.0 < dVar1;
}

Assistant:

virtual bool scatter(
            const ray& r_in, const hit_record& rec, vec3& attenuation, ray& scattered
    ) const {
        vec3 reflected = reflect(unit_vector(r_in.direction()), rec.normal);
        scattered = ray(rec.p, reflected + fuzz * random_in_sphere(), r_in.time());
        attenuation = albedo;
        return (dot(scattered.direction(), rec.normal) > 0);
    }